

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian.cpp
# Opt level: O3

void get_interest_points(fasthessian *fh,
                        vector<interest_point,_std::allocator<interest_point>_> *interest_points)

{
  int iVar1;
  response_layer *top;
  response_layer *bottom;
  response_layer *middle;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int row;
  bool bVar7;
  int iVar8;
  
  if (0 < fh->octaves) {
    lVar5 = 0;
    do {
      lVar3 = 0;
      uVar4 = (ulong)(uint)(&DAT_001a2060)[lVar5 * 4];
      bVar2 = true;
      do {
        bVar7 = bVar2;
        iVar1 = (&DAT_001a2064)[lVar5 * 4 + lVar3];
        top = fh->response_map[(int)(&DAT_001a2068)[lVar5 * 4 + lVar3]];
        iVar6 = top->height;
        if (0 < iVar6) {
          iVar8 = top->width;
          row = 0;
          bottom = fh->response_map[(int)uVar4];
          middle = fh->response_map[iVar1];
          do {
            if (0 < iVar8) {
              iVar6 = 0;
              do {
                bVar2 = is_extremum(row,iVar6,top,middle,bottom,fh->thresh);
                if (bVar2) {
                  interpolate_extremum(row,iVar6,top,middle,bottom,interest_points);
                  iVar8 = top->width;
                }
                iVar6 = iVar6 + 1;
              } while (iVar6 < iVar8);
              iVar6 = top->height;
            }
            row = row + 1;
          } while (row < iVar6);
        }
        lVar3 = 1;
        uVar4 = (long)iVar1;
        bVar2 = false;
      } while (bVar7);
      lVar5 = lVar5 + 1;
    } while (lVar5 < fh->octaves);
  }
  return;
}

Assistant:

void get_interest_points(struct fasthessian *fh, std::vector<struct interest_point> *interest_points) {

    assert(fh != NULL);
    assert(interest_points != NULL);

    // filter index map
    const int filter_map[NUM_OCTAVES][NUM_LAYERS] = {
        {0, 1, 2, 3},
        {1, 3, 4, 5},
        {3, 5, 6, 7},
        //{5, 7, 8, 9},
        //{7, 9, 10, 11}
    };

    // getting response layers
    struct response_layer *bottom;
    struct response_layer *middle;
    struct response_layer *top;

    // iterating through all octaves and each layer of octave in window of three (top, middle, bottom)
    for (int o = 0; o < fh->octaves; ++o) {

        // TODO: (Sebastian) allow for fh->layers != 4 as well (note that fh->layers>=3 has to hold)
        for (int i = 0; i <= 1; ++i) {

            // assigning respective bottom, middle and top response layer
            bottom = fh->response_map[filter_map[o][i]];
            middle = fh->response_map[filter_map[o][i+1]];
            top = fh->response_map[filter_map[o][i+2]];

            // iterating over middle response layer at density of the most sparse layer (always top),
            // to find maxima accreoss scale and space
            for (int r = 0; r < top->height; ++r) {
                for (int c = 0; c < top->width; ++c) {

                    // checking if current pixel position is local maximum in 3x3x3 maximum and above threshold
                    if (is_extremum(r, c, top, middle, bottom, fh->thresh)) {

                        // sub-pixel interpolating local maxium and adding to resulting interest point vector
                        interpolate_extremum(r, c, top, middle, bottom, interest_points);

                    }

                }
            }

        }
    }

}